

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

void __thiscall QTreeWidgetItem::~QTreeWidgetItem(QTreeWidgetItem *this)

{
  long lVar1;
  QList<QTreeWidgetItem_*> *this_00;
  QTreeWidgetItemPrivate *pQVar2;
  Data *pDVar3;
  long lVar4;
  undefined1 uVar5;
  QTreeModel *this_01;
  long lVar6;
  long lVar7;
  undefined1 uVar8;
  QTreeWidgetItem *pQVar9;
  ulong uVar10;
  uint uVar11;
  
  this->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00810850;
  this_01 = treeModel(this,(QTreeWidget *)0x0);
  if (this_01 == (QTreeModel *)0x0) {
    pQVar9 = this->par;
    uVar8 = false;
    uVar5 = 0;
    if (pQVar9 == (QTreeWidgetItem *)0x0) goto LAB_005b0443;
LAB_005b03a2:
    uVar8 = uVar5;
    lVar6 = (pQVar9->children).d.size;
    if (lVar6 == 0) goto LAB_005b0443;
    lVar7 = -8;
    do {
      if (lVar6 * -8 + lVar7 == -8) goto LAB_005b0443;
      lVar1 = lVar7 + 8;
      lVar4 = lVar7 + 8;
      lVar7 = lVar1;
    } while (*(QTreeWidgetItem **)((long)(pQVar9->children).d.ptr + lVar4) != this);
    uVar11 = (uint)(lVar1 >> 3);
    if ((int)uVar11 < 0) goto LAB_005b0443;
    if (this_01 != (QTreeModel *)0x0) {
      QTreeModel::beginRemoveItems(this_01,pQVar9,uVar11,1);
      pQVar9 = this->par;
      lVar6 = (pQVar9->children).d.size;
    }
    if ((lVar6 != 0) && ((pQVar9->children).d.ptr[uVar11 & 0x7fffffff] == this)) {
      QList<QTreeWidgetItem_*>::takeAt(&pQVar9->children,(ulong)(uVar11 & 0x7fffffff));
    }
    if (this_01 == (QTreeModel *)0x0) goto LAB_005b0443;
  }
  else {
    uVar8 = this_01->skipPendingSort;
    this_01->skipPendingSort = true;
    pQVar9 = this->par;
    uVar5 = uVar8;
    if (pQVar9 != (QTreeWidgetItem *)0x0) goto LAB_005b03a2;
    if (this_01->headerItem == this) {
      this_01->headerItem = (QTreeWidgetItem *)0x0;
      goto LAB_005b0443;
    }
    lVar6 = (this_01->rootItem->children).d.size;
    if (lVar6 == 0) goto LAB_005b0443;
    lVar7 = -8;
    do {
      if (lVar6 * -8 + lVar7 == -8) goto LAB_005b0443;
      lVar1 = lVar7 + 8;
      lVar4 = lVar7 + 8;
      lVar7 = lVar1;
    } while (*(QTreeWidgetItem **)((long)(this_01->rootItem->children).d.ptr + lVar4) != this);
    uVar11 = (uint)(lVar1 >> 3);
    if ((int)uVar11 < 0) goto LAB_005b0443;
    QTreeModel::beginRemoveItems(this_01,(QTreeWidgetItem *)0x0,uVar11,1);
    pQVar9 = this_01->rootItem;
    if (((pQVar9->children).d.size != 0) && ((pQVar9->children).d.ptr[uVar11 & 0x7fffffff] == this))
    {
      QList<QTreeWidgetItem_*>::takeAt(&pQVar9->children,(ulong)(uVar11 & 0x7fffffff));
    }
  }
  QAbstractItemModel::endRemoveRows();
LAB_005b0443:
  if ((this->children).d.size != 0) {
    uVar10 = 0;
    do {
      pQVar9 = (this->children).d.ptr[uVar10];
      pQVar9->par = (QTreeWidgetItem *)0x0;
      pQVar9->view = (QTreeWidget *)0x0;
      (*pQVar9->_vptr_QTreeWidgetItem[1])();
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)(this->children).d.size);
  }
  this_00 = &this->children;
  QList<QTreeWidgetItem_*>::clear(this_00);
  pQVar2 = this->d;
  if (pQVar2 != (QTreeWidgetItemPrivate *)0x0) {
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&(pQVar2->display).d);
  }
  operator_delete(pQVar2,0x30);
  if (this_01 != (QTreeModel *)0x0) {
    this_01->skipPendingSort = (bool)uVar8;
  }
  pDVar3 = (this_00->d).d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  QArrayDataPointer<QList<QWidgetItemData>_>::~QArrayDataPointer(&(this->values).d);
  return;
}

Assistant:

QTreeWidgetItem::~QTreeWidgetItem()
{
    QTreeModel *model = treeModel();
    QTreeModel::SkipSorting skipSorting(model);

    if (par) {
        int i = par->children.indexOf(this);
        if (i >= 0) {
            if (model) model->beginRemoveItems(par, i, 1);
            // users _could_ do changes when connected to rowsAboutToBeRemoved,
            // so we check again to make sure 'i' is valid
            if (!par->children.isEmpty() && par->children.at(i) == this)
                par->children.takeAt(i);
            if (model) model->endRemoveItems();
        }
    } else if (model) {
        if (this == model->headerItem) {
            model->headerItem = nullptr;
        } else {
            int i = model->rootItem->children.indexOf(this);
            if (i >= 0) {
                model->beginRemoveItems(nullptr, i, 1);
                // users _could_ do changes when connected to rowsAboutToBeRemoved,
                // so we check again to make sure 'i' is valid
                if (!model->rootItem->children.isEmpty() && model->rootItem->children.at(i) == this)
                    model->rootItem->children.takeAt(i);
                model->endRemoveItems();
            }
        }
    }
    // at this point the persistent indexes for the children should also be invalidated
    // since we invalidated the parent
    for (int i = 0; i < children.size(); ++i) {
        QTreeWidgetItem *child = children.at(i);
        // make sure the child does not try to remove itself from our children list
        child->par = nullptr;
        // make sure the child does not try to remove itself from the top level list
        child->view = nullptr;
        delete child;
    }

    children.clear();
    delete d;
}